

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,string *srcName,string *apiName,
               UniformLayout *layout,int blockNdx,void *basePtr,deUint32 unusedMask,
               MatrixLoadFlags matrixLoadFlag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DataType dataType;
  pointer pcVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  char *pcVar7;
  UniformLayoutEntry *entry;
  size_t sVar8;
  ostream *poVar9;
  size_type *psVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  ulong *puVar14;
  undefined4 in_stack_0000000c;
  MatrixLoadFlags MVar15;
  string elementApiName;
  string local_238;
  string *local_218;
  string op;
  string fullApiName;
  string elementSrcName;
  ios_base local_138 [264];
  
  iVar12 = *(int *)resultVar;
  local_218 = (string *)type;
  if (iVar12 != 0) {
    if (iVar12 != 1) {
      puVar14 = *(ulong **)(*(long *)(resultVar + 8) + 0x20);
      if (puVar14 == *(ulong **)(*(long *)(resultVar + 8) + 0x28)) {
        return;
      }
      paVar1 = &elementApiName.field_2;
      do {
        if (((uint)puVar14[7] & (uint)basePtr) == 0) {
          op._M_dataplus._M_p = (pointer)&op.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&op,".","");
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&op,*puVar14);
          psVar10 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar10) {
            elementSrcName.field_2._M_allocated_capacity = *psVar10;
            elementSrcName.field_2._8_8_ = plVar6[3];
            elementSrcName._M_dataplus._M_p = (pointer)&elementSrcName.field_2;
          }
          else {
            elementSrcName.field_2._M_allocated_capacity = *psVar10;
            elementSrcName._M_dataplus._M_p = (pointer)*plVar6;
          }
          elementSrcName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op._M_dataplus._M_p != &op.field_2) {
            operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
          }
          elementApiName._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&elementApiName,*(long *)local_218,
                     (long)&((((Data *)&local_218->_M_string_length)->array).elementType)->m_type +
                     *(long *)local_218);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&elementApiName,(ulong)elementSrcName._M_dataplus._M_p
                                     );
          op._M_dataplus._M_p = (pointer)&op.field_2;
          psVar10 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar10) {
            op.field_2._M_allocated_capacity = *psVar10;
            op.field_2._8_8_ = plVar6[3];
          }
          else {
            op.field_2._M_allocated_capacity = *psVar10;
            op._M_dataplus._M_p = (pointer)*plVar6;
          }
          op._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)elementApiName._M_dataplus._M_p != paVar1) {
            operator_delete(elementApiName._M_dataplus._M_p,
                            elementApiName.field_2._M_allocated_capacity + 1);
          }
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          pcVar3 = (srcName->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,pcVar3,pcVar3 + srcName->_M_string_length);
          MVar15 = 0x69270f;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_238,(ulong)elementSrcName._M_dataplus._M_p);
          psVar10 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar10) {
            elementApiName.field_2._M_allocated_capacity = *psVar10;
            elementApiName.field_2._8_8_ = plVar6[3];
            elementApiName._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            elementApiName.field_2._M_allocated_capacity = *psVar10;
            elementApiName._M_dataplus._M_p = (pointer)*plVar6;
          }
          elementApiName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            MVar15 = 0x69276c;
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          generateCompareSrc(src,(char *)(puVar14 + 4),(VarType *)&op,&elementApiName,apiName,
                             (UniformLayout *)((ulong)layout & 0xffffffff),blockNdx,
                             (void *)((ulong)basePtr & 0xffffffff),0,MVar15);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)elementApiName._M_dataplus._M_p != paVar1) {
            operator_delete(elementApiName._M_dataplus._M_p,
                            elementApiName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op._M_dataplus._M_p != &op.field_2) {
            operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)elementSrcName._M_dataplus._M_p != &elementSrcName.field_2) {
            operator_delete(elementSrcName._M_dataplus._M_p,
                            elementSrcName.field_2._M_allocated_capacity + 1);
          }
        }
        puVar14 = puVar14 + 8;
      } while (puVar14 != *(ulong **)(*(long *)(resultVar + 8) + 0x28));
      return;
    }
    if (**(int **)(resultVar + 8) != 0) {
      if (*(int *)(resultVar + 0x10) < 1) {
        return;
      }
      pcVar7 = *(char **)(resultVar + 8);
      paVar1 = &elementApiName.field_2;
      iVar12 = 0;
      do {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"[","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&elementSrcName);
        std::ostream::operator<<(&elementSrcName,iVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&elementSrcName);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar11 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < fullApiName._M_string_length + local_238._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fullApiName._M_dataplus._M_p != &fullApiName.field_2) {
            uVar11 = fullApiName.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < fullApiName._M_string_length + local_238._M_string_length)
          goto LAB_00692234;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&fullApiName,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
        }
        else {
LAB_00692234:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_238,(ulong)fullApiName._M_dataplus._M_p);
        }
        psVar10 = puVar5 + 2;
        if ((size_type *)*puVar5 == psVar10) {
          elementApiName.field_2._M_allocated_capacity = *psVar10;
          elementApiName.field_2._8_8_ = puVar5[3];
          elementApiName._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          elementApiName.field_2._M_allocated_capacity = *psVar10;
          elementApiName._M_dataplus._M_p = (pointer)*puVar5;
        }
        elementApiName._M_string_length = puVar5[1];
        *puVar5 = psVar10;
        puVar5[1] = 0;
        *(char *)psVar10 = '\0';
        plVar6 = (long *)std::__cxx11::string::append((char *)&elementApiName);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          op.field_2._M_allocated_capacity = *psVar10;
          op.field_2._8_8_ = plVar6[3];
          op._M_dataplus._M_p = (pointer)&op.field_2;
        }
        else {
          op.field_2._M_allocated_capacity = *psVar10;
          op._M_dataplus._M_p = (pointer)*plVar6;
        }
        op._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementApiName._M_dataplus._M_p != paVar1) {
          operator_delete(elementApiName._M_dataplus._M_p,
                          elementApiName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullApiName._M_dataplus._M_p != &fullApiName.field_2) {
          operator_delete(fullApiName._M_dataplus._M_p,fullApiName.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        elementApiName._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&elementApiName,*(long *)local_218,
                   (long)&((((Data *)&local_218->_M_string_length)->array).elementType)->m_type +
                   *(long *)local_218);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&elementApiName,(ulong)op._M_dataplus._M_p);
        elementSrcName._M_dataplus._M_p = (pointer)&elementSrcName.field_2;
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          elementSrcName.field_2._M_allocated_capacity = *psVar10;
          elementSrcName.field_2._8_8_ = plVar6[3];
        }
        else {
          elementSrcName.field_2._M_allocated_capacity = *psVar10;
          elementSrcName._M_dataplus._M_p = (pointer)*plVar6;
        }
        elementSrcName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementApiName._M_dataplus._M_p != paVar1) {
          operator_delete(elementApiName._M_dataplus._M_p,
                          elementApiName.field_2._M_allocated_capacity + 1);
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        pcVar3 = (srcName->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,pcVar3,pcVar3 + srcName->_M_string_length);
        MVar15 = 0x69241e;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_238,(ulong)op._M_dataplus._M_p);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          elementApiName.field_2._M_allocated_capacity = *psVar10;
          elementApiName.field_2._8_8_ = plVar6[3];
          elementApiName._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          elementApiName.field_2._M_allocated_capacity = *psVar10;
          elementApiName._M_dataplus._M_p = (pointer)*plVar6;
        }
        elementApiName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          MVar15 = 0x692489;
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        generateCompareSrc(src,pcVar7,(VarType *)&elementSrcName,&elementApiName,apiName,
                           (UniformLayout *)((ulong)layout & 0xffffffff),blockNdx,
                           (void *)((ulong)basePtr & 0xffffffff),0,MVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementApiName._M_dataplus._M_p != paVar1) {
          operator_delete(elementApiName._M_dataplus._M_p,
                          elementApiName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementSrcName._M_dataplus._M_p != &elementSrcName.field_2) {
          operator_delete(elementSrcName._M_dataplus._M_p,
                          elementSrcName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op._M_dataplus._M_p != &op.field_2) {
          operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
        }
        iVar12 = iVar12 + 1;
        if (*(int *)(resultVar + 0x10) <= iVar12) {
          return;
        }
      } while( true );
    }
  }
  pcVar7 = resultVar;
  if (iVar12 == 1) {
    pcVar7 = *(char **)(resultVar + 8);
  }
  dataType = *(DataType *)(pcVar7 + 8);
  pcVar7 = glu::getDataTypeName(dataType);
  elementSrcName._M_dataplus._M_p = (pointer)&elementSrcName.field_2;
  pcVar3 = (srcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&elementSrcName,pcVar3,pcVar3 + srcName->_M_string_length);
  plVar6 = (long *)std::__cxx11::string::append((char *)&elementSrcName);
  fullApiName._M_dataplus._M_p = (pointer)&fullApiName.field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    fullApiName.field_2._M_allocated_capacity = *psVar10;
    fullApiName.field_2._8_8_ = plVar6[3];
  }
  else {
    fullApiName.field_2._M_allocated_capacity = *psVar10;
    fullApiName._M_dataplus._M_p = (pointer)*plVar6;
  }
  paVar1 = &elementSrcName.field_2;
  fullApiName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementSrcName._M_dataplus._M_p != paVar1) {
    operator_delete(elementSrcName._M_dataplus._M_p,elementSrcName.field_2._M_allocated_capacity + 1
                   );
  }
  iVar4 = UniformLayout::getUniformLayoutIndex((UniformLayout *)apiName,(int)layout,&fullApiName);
  entry = (UniformLayoutEntry *)((long)iVar4 * 0x40 + *(long *)((long)&apiName->field_2 + 8));
  if (iVar12 == 1) {
    if (0 < *(int *)(resultVar + 0x10)) {
      iVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)src,"\tresult *= compare_",0x13);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"(",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)src,(local_218->_M_dataplus)._M_p,local_218->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[",1);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"], ",3);
        generateValueSrc(src,entry,(void *)CONCAT44(in_stack_0000000c,blockNdx),iVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,");\n",3);
        iVar12 = iVar12 + 1;
      } while (iVar12 < *(int *)(resultVar + 0x10));
    }
    goto LAB_00693304;
  }
  if (unusedMask == 0) {
    pcVar7 = glu::getDataTypeName(dataType);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\tresult *= compare_",0x13);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"(",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)src,(local_218->_M_dataplus)._M_p,local_218->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    generateValueSrc(src,entry,(void *)CONCAT44(in_stack_0000000c,blockNdx),0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,");\n",3);
    goto LAB_00693304;
  }
  uVar13 = dataType - TYPE_FLOAT_MAT2;
  if (8 < uVar13) goto LAB_00693304;
  elementSrcName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
  elementSrcName._M_string_length = 8;
  elementSrcName.field_2._8_8_ = elementSrcName.field_2._8_8_ & 0xffffffffffffff00;
  elementSrcName._M_dataplus._M_p = (pointer)paVar1;
  switch(uVar13) {
  case 0:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = op.field_2._8_8_ & 0xffffffffffffff00;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x32636576;
    writeMatrixTypeSrc(2,2,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 1:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x33636576;
    writeMatrixTypeSrc(2,3,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 2:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x34636576;
    writeMatrixTypeSrc(2,4,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  default:
    goto switchD_00692a87_caseD_3;
  case 5:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x34636576;
    writeMatrixTypeSrc(3,4,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 6:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x32636576;
    writeMatrixTypeSrc(4,2,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 7:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x33636576;
    writeMatrixTypeSrc(4,3,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 8:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x34636576;
    writeMatrixTypeSrc(4,4,&op,&elementApiName,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementApiName._M_dataplus._M_p != &elementApiName.field_2) {
    operator_delete(elementApiName._M_dataplus._M_p,elementApiName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
  }
switchD_00692a87_caseD_3:
  paVar1 = &elementSrcName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementSrcName._M_dataplus._M_p != paVar1) {
    operator_delete(elementSrcName._M_dataplus._M_p,elementSrcName.field_2._M_allocated_capacity + 1
                   );
  }
  elementSrcName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
  elementSrcName._M_string_length = 8;
  elementSrcName.field_2._8_8_ = elementSrcName.field_2._8_8_ & 0xffffffffffffff00;
  paVar2 = &op.field_2;
  op.field_2._M_allocated_capacity._0_6_ = 0x74616f6c66;
  op._M_string_length = 5;
  op._M_dataplus._M_p = (pointer)paVar2;
  elementSrcName._M_dataplus._M_p = (pointer)paVar1;
  switch(uVar13) {
  case 0:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = elementApiName.field_2._8_8_ & 0xffffffffffffff00;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(2,2,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 1:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(2,3,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 2:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(2,4,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  default:
    goto switchD_00692f61_caseD_3;
  case 5:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(3,4,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 6:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(4,2,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 7:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(4,3,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 8:
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    elementApiName._M_string_length = 8;
    elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,paVar2,(undefined1 *)((long)&op.field_2 + 5));
    writeMatrixTypeSrc(4,4,&elementApiName,&local_238,src,local_218,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementApiName._M_dataplus._M_p != &elementApiName.field_2) {
    operator_delete(elementApiName._M_dataplus._M_p,elementApiName.field_2._M_allocated_capacity + 1
                   );
  }
switchD_00692f61_caseD_3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != paVar2) {
    operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementSrcName._M_dataplus._M_p != &elementSrcName.field_2) {
    operator_delete(elementSrcName._M_dataplus._M_p,elementSrcName.field_2._M_allocated_capacity + 1
                   );
  }
LAB_00693304:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fullApiName._M_dataplus._M_p != &fullApiName.field_2) {
    operator_delete(fullApiName._M_dataplus._M_p,fullApiName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream&	src,
						 const char*			resultVar,
						 const VarType&			type,
						 const std::string&		srcName,
						 const std::string&		apiName,
						 const UniformLayout&	layout,
						 int					blockNdx,
						 const void*			basePtr,
						 deUint32				unusedMask,
						 MatrixLoadFlags		matrixLoadFlag)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool						isArray			= type.isArrayType();
		glu::DataType				elementType		= isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*					typeName		= glu::getDataTypeName(elementType);
		std::string					fullApiName		= std::string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int							uniformNdx		= layout.getUniformLayoutIndex(blockNdx, fullApiName);
		const UniformLayoutEntry&	entry			= layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			generateSingleCompare(src, elementType, srcName, basePtr, entry, matrixLoadFlag);
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = std::string("[") + de::toString(elementNdx) + "]";
			std::string elementSrcName = std::string(srcName) + op;
			std::string elementApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, elementType, elementSrcName, elementApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			std::string op = std::string(".") + memberIter->getName();
			std::string memberSrcName = std::string(srcName) + op;
			std::string memberApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, memberIter->getType(), memberSrcName, memberApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
}